

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O0

void __thiscall ECDSATest_MaxSigLen_Test::TestBody(ECDSATest_MaxSigLen_Test *this)

{
  allocator<unsigned_char> *this_00;
  bool bVar1;
  size_t __n;
  ECDSA_SIG *__p;
  char *pcVar2;
  uchar *puVar3;
  size_type sVar4;
  pointer peVar5;
  char *in_R9;
  AssertHelper local_1d0;
  Message local_1c8;
  size_t local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_188;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__3;
  size_t der_len;
  uint8_t *der;
  AssertHelper local_130;
  Message local_128;
  BIGNUM *local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_e8;
  Message local_e0;
  BIGNUM *local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  UniquePtr<ECDSA_SIG> sig;
  size_t order_len;
  size_t sStack_30;
  ScopedTrace gtest_trace_269;
  size_t bits;
  size_t *__end1;
  size_t *__begin1;
  size_t (*__range1) [5];
  ECDSATest_MaxSigLen_Test *this_local;
  
  __end1 = TestBody::kBits;
  while( true ) {
    if (__end1 == (size_t *)"28ECDSATest_BuiltinCurves_Test") {
      return;
    }
    sStack_30 = *__end1;
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              ((ScopedTrace *)((long)&order_len + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x10d,&stack0xffffffffffffffd0);
    __n = BitsToBytes(sStack_30);
    __p = ECDSA_SIG_new();
    std::unique_ptr<ecdsa_sig_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ecdsa_sig_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)__p)
    ;
    testing::AssertionResult::AssertionResult<std::unique_ptr<ecdsa_sig_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_68,
               (unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_98,(internal *)local_68,(AssertionResult *)0x8b3263,"false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                 ,0x112,pcVar2);
      testing::internal::AssertHelper::operator=(&local_78,&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      testing::Message::~Message(&local_70);
    }
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
    if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._7_1_ = 0xff;
      this_00 = (allocator<unsigned_char> *)
                ((long)&gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                + 6);
      std::allocator<unsigned_char>::allocator(this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,__n,
                 (value_type_conflict1 *)
                 ((long)&gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7),this_00);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 6));
      puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
      peVar5 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      local_d8 = BN_bin2bn(puVar3,(int)sVar4,(BIGNUM *)peVar5->r);
      testing::AssertionResult::AssertionResult<bignum_st*>
                ((AssertionResult *)local_d0,(bignum_st **)&local_d8,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_d0,
                   (AssertionResult *)"BN_bin2bn(bytes.data(), bytes.size(), sig->r)","false","true"
                   ,in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                   ,0x114,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_e0);
      }
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
        peVar5 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                           );
        local_120 = BN_bin2bn(puVar3,(int)sVar4,(BIGNUM *)peVar5->s);
        testing::AssertionResult::AssertionResult<bignum_st*>
                  ((AssertionResult *)local_118,(bignum_st **)&local_120,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&der,(internal *)local_118,
                     (AssertionResult *)"BN_bin2bn(bytes.data(), bytes.size(), sig->s)","false",
                     "true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0x115,pcVar2);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&der);
          testing::Message::~Message(&local_128);
        }
        bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          peVar5 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          local_174 = ECDSA_SIG_to_bytes((uint8_t **)&der_len,(size_t *)&gtest_ar__3.message_,peVar5
                                        );
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_170,&local_174,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
          if (!bVar1) {
            testing::Message::Message(&local_180);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_170,
                       (AssertionResult *)"ECDSA_SIG_to_bytes(&der, &der_len, sig.get())","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_188,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                       ,0x119,pcVar2);
            testing::internal::AssertHelper::operator=(&local_188,&local_180);
            testing::internal::AssertHelper::~AssertHelper(&local_188);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_180);
          }
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
          if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
            OPENSSL_free((void *)der_len);
            local_1c0 = ECDSA_SIG_max_len(__n);
            testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                      ((EqHelper *)local_1b8,"der_len","ECDSA_SIG_max_len(order_len)",
                       (unsigned_long *)&gtest_ar__3.message_,&local_1c0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
            if (!bVar1) {
              testing::Message::Message(&local_1c8);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
              testing::internal::AssertHelper::AssertHelper
                        (&local_1d0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0x11c,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
              testing::internal::AssertHelper::~AssertHelper(&local_1d0);
              testing::Message::~Message(&local_1c8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
            bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
    }
    std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&order_len + 7));
    if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) break;
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST(ECDSATest, MaxSigLen) {
  static const size_t kBits[] = {224, 256, 384, 521, 10000};
  for (size_t bits : kBits) {
    SCOPED_TRACE(bits);
    size_t order_len = BitsToBytes(bits);

    // Create the largest possible |ECDSA_SIG| of the given constraints.
    bssl::UniquePtr<ECDSA_SIG> sig(ECDSA_SIG_new());
    ASSERT_TRUE(sig);
    std::vector<uint8_t> bytes(order_len, 0xff);
    ASSERT_TRUE(BN_bin2bn(bytes.data(), bytes.size(), sig->r));
    ASSERT_TRUE(BN_bin2bn(bytes.data(), bytes.size(), sig->s));
    // Serialize it.
    uint8_t *der;
    size_t der_len;
    ASSERT_TRUE(ECDSA_SIG_to_bytes(&der, &der_len, sig.get()));
    OPENSSL_free(der);

    EXPECT_EQ(der_len, ECDSA_SIG_max_len(order_len));
  }
}